

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O3

void __thiscall vectorgraphics::Style::applyStyle(Style *this,StyleMap *style_map)

{
  mapped_type *pmVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->style_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->style_map_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](style_map,(key_type *)(p_Var2 + 1));
    std::__cxx11::string::_M_assign((string *)pmVar1);
  }
  return;
}

Assistant:

void Style::applyStyle(StyleMap& style_map) const {
    for(const auto& style_pair : style_map_) {
      style_map[style_pair.first] = style_pair.second;
    }
  }